

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

FlowEdge * __thiscall
FlowGraph::AddEdge(FlowGraph *this,BasicBlock *blockPred,BasicBlock *blockSucc)

{
  FlowEdge *edge;
  
  edge = FlowEdge::New(this);
  edge->predBlock = blockPred;
  edge->succBlock = blockSucc;
  BasicBlock::AddSucc(blockPred,edge,this);
  BasicBlock::AddPred(blockSucc,edge,this);
  return edge;
}

Assistant:

FlowEdge *
FlowGraph::AddEdge(BasicBlock * blockPred, BasicBlock * blockSucc)
{
    FlowEdge * edge = FlowEdge::New(this);
    edge->SetPred(blockPred);
    edge->SetSucc(blockSucc);
    blockPred->AddSucc(edge, this);
    blockSucc->AddPred(edge, this);

    return edge;
}